

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

void __thiscall wasm::Debug::FuncAddrMap::FuncAddrMap(FuncAddrMap *this,Module *wasm)

{
  bool bVar1;
  pointer pFVar2;
  pointer pFVar3;
  mapped_type *ppFVar4;
  key_type local_48 [4];
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  Module *wasm_local;
  FuncAddrMap *this_local;
  
  std::
  unordered_map<unsigned_int,_wasm::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
  ::unordered_map(&this->startMap);
  std::
  unordered_map<unsigned_int,_wasm::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
  ::unordered_map(&this->endMap);
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(&wasm->functions);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(&wasm->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&func);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end2);
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_38);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_38);
    ppFVar4 = std::
              unordered_map<unsigned_int,_wasm::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
              ::operator[](&this->startMap,&(pFVar3->funcLocation).start);
    *ppFVar4 = pFVar2;
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_38);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_38);
    ppFVar4 = std::
              unordered_map<unsigned_int,_wasm::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
              ::operator[](&this->startMap,&(pFVar3->funcLocation).declarations);
    *ppFVar4 = pFVar2;
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_38);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_38);
    local_48[0] = (pFVar3->funcLocation).end - 1;
    ppFVar4 = std::
              unordered_map<unsigned_int,_wasm::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
              ::operator[](&this->endMap,local_48);
    *ppFVar4 = pFVar2;
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_38);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_38);
    ppFVar4 = std::
              unordered_map<unsigned_int,_wasm::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
              ::operator[](&this->endMap,&(pFVar3->funcLocation).end);
    *ppFVar4 = pFVar2;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

FuncAddrMap(const Module& wasm) {
    for (auto& func : wasm.functions) {
      startMap[func->funcLocation.start] = func.get();
      startMap[func->funcLocation.declarations] = func.get();
      endMap[func->funcLocation.end - 1] = func.get();
      endMap[func->funcLocation.end] = func.get();
    }
  }